

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O0

QStringList * QMilankovicCalendar::nameList(void)

{
  initializer_list<QString> args;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_ffffffffffffff28;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff30;
  QList<QString> *in_stack_ffffffffffffff58;
  long *plVar1;
  iterator in_stack_ffffffffffffff60;
  long *plVar2;
  size_type in_stack_ffffffffffffff68;
  QArrayDataPointer<char16_t> local_38;
  long local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_38,(Data *)0x0,L"Milankovic",10);
  QString::QString((QString *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  args._M_len = in_stack_ffffffffffffff68;
  args._M_array = in_stack_ffffffffffffff60;
  QList<QString>::QList(in_stack_ffffffffffffff58,args);
  plVar2 = local_20;
  plVar1 = &local_8;
  do {
    plVar1 = plVar1 + -3;
    QString::~QString((QString *)0x57e1d1);
  } while (plVar1 != plVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QMilankovicCalendar::nameList()
{
    return { QStringLiteral("Milankovic") };
}